

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O2

sshcom_key * load_sshcom_key(BinarySource *src,char **errmsg_p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  sshcom_key *__dest;
  strbuf *psVar6;
  byte *__s1;
  ushort **ppuVar7;
  char *__s;
  size_t sVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  char *pcVar12;
  byte *pbVar13;
  long lVar14;
  byte *__s_00;
  char base64_bit [4];
  uchar out [3];
  
  __dest = (sshcom_key *)safemalloc(1,0x108,0);
  __dest->comment[0] = '\0';
  psVar6 = strbuf_new_nm();
  __dest->keyblob = psVar6;
  __s1 = (byte *)bsgetline(src);
  if (__s1 != (byte *)0x0) {
    iVar3 = strcmp((char *)__s1,"---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----");
    if (iVar3 != 0) {
      pcVar12 = "file does not begin with ssh.com key header";
LAB_00116b32:
      sVar8 = strlen((char *)__s1);
      smemclr(__s1,sVar8);
      safefree(__s1);
      goto LAB_00116b4d;
    }
    sVar8 = strlen((char *)__s1);
    smemclr(__s1,sVar8);
    safefree(__s1);
    iVar3 = 0;
    bVar11 = false;
    while (__s1 = (byte *)bsgetline(src), __s1 != (byte *)0x0) {
      iVar4 = strcmp((char *)__s1,"---- END SSH2 ENCRYPTED PRIVATE KEY ----");
      if (iVar4 == 0) {
        safefree(__s1);
        if (__dest->keyblob->len == 0) {
          pcVar12 = "key body not present";
          goto LAB_00116b4d;
        }
        if (errmsg_p == (char **)0x0) {
          return __dest;
        }
        pcVar12 = (char *)0x0;
        goto LAB_00116b77;
      }
      pcVar12 = strchr((char *)__s1,0x3a);
      pbVar13 = __s1;
      if (pcVar12 == (char *)0x0) {
        while (((bVar1 = *pbVar13, (byte)(bVar1 - 0x30) < 10 ||
                ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
               ((bVar1 < 0x3e && ((0x2000880000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))))
        {
          lVar10 = (long)iVar3;
          iVar3 = iVar3 + 1;
          base64_bit[lVar10] = bVar1;
          if (iVar3 == 4) {
            uVar5 = base64_decode_atom(base64_bit,out);
            if ((int)uVar5 < 1) {
              pcVar12 = "invalid base64 encoding";
              goto LAB_00116b32;
            }
            BinarySink_put_data(__dest->keyblob->binarysink_,out,(ulong)uVar5);
            iVar3 = 0;
          }
          pbVar13 = pbVar13 + 1;
        }
      }
      else {
        if (bVar11) {
          pcVar12 = "header found in body of key data";
          goto LAB_00116b32;
        }
        *pcVar12 = '\0';
        pbVar13 = (byte *)(pcVar12 + 1);
        iVar4 = (int)pcVar12 - (int)__s1;
        lVar10 = (long)pbVar13 - (long)__s1;
        lVar2 = (long)pbVar13 - (long)__s1 << 0x20;
        do {
          lVar14 = lVar2;
          lVar9 = lVar10;
          iVar4 = iVar4 + 1;
          bVar1 = *pbVar13;
          if ((ulong)bVar1 == 0) break;
          ppuVar7 = __ctype_b_loc();
          pbVar13 = pbVar13 + 1;
          lVar10 = lVar9 + 1;
          lVar2 = lVar14 + 0x100000000;
        } while ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        lVar14 = lVar14 >> 0x20;
        sVar8 = strlen((char *)(__s1 + lVar14));
        if (__s1[(int)lVar9 + (int)sVar8] != 0) {
          __assert_fail("!line[len]",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                        ,0x6fd,"struct sshcom_key *load_sshcom_key(BinarySource *, const char **)");
        }
        iVar4 = (int)sVar8 + iVar4;
        while (__s1[(long)iVar4 + -1] == 0x5c) {
          __s = bsgetline(src);
          if (__s == (char *)0x0) {
            pcVar12 = "unexpected end of file";
            goto LAB_00116b32;
          }
          sVar8 = strlen(__s);
          __s1 = (byte *)saferealloc(__s1,(long)((int)sVar8 + iVar4 + 1),1);
          strcpy((char *)(__s1 + (long)iVar4 + -1),__s);
          iVar4 = iVar4 + -1 + (int)sVar8;
          if (__s1[iVar4] != 0) {
            __assert_fail("!line[len]",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                          ,0x70c,"struct sshcom_key *load_sshcom_key(BinarySource *, const char **)"
                         );
          }
          sVar8 = strlen(__s);
          smemclr(__s,sVar8);
          safefree(__s);
        }
        iVar4 = strcmp((char *)__s1,"Comment");
        if (iVar4 == 0) {
          __s_00 = __s1 + lVar14;
          pbVar13 = __s_00;
          if ((*__s_00 == 0x22) && (sVar8 = strlen((char *)__s_00), __s_00[sVar8 - 1] == 0x22)) {
            pbVar13 = __s_00 + 1;
            sVar8 = strlen((char *)pbVar13);
            __s_00[sVar8] = 0;
          }
          strncpy((char *)__dest,(char *)pbVar13,0x100);
          __dest->comment[0xff] = '\0';
        }
      }
      sVar8 = strlen((char *)__s1);
      smemclr(__s1,sVar8);
      safefree(__s1);
      bVar11 = pcVar12 == (char *)0x0;
    }
  }
  pcVar12 = "unexpected end of file";
LAB_00116b4d:
  strbuf_free(__dest->keyblob);
  smemclr(__dest,0x108);
  safefree(__dest);
  __dest = (sshcom_key *)0x0;
  if (errmsg_p != (char **)0x0) {
LAB_00116b77:
    *errmsg_p = pcVar12;
  }
  return __dest;
}

Assistant:

static struct sshcom_key *load_sshcom_key(BinarySource *src,
                                          const char **errmsg_p)
{
    struct sshcom_key *ret;
    char *line = NULL;
    int hdrstart, len;
    const char *errmsg;
    char *p;
    bool headers_done;
    char base64_bit[4];
    int base64_chars = 0;

    ret = snew(struct sshcom_key);
    ret->comment[0] = '\0';
    ret->keyblob = strbuf_new_nm();

    if (!(line = bsgetline(src))) {
        errmsg = "unexpected end of file";
        goto error;
    }
    if (0 != strcmp(line, "---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----")) {
        errmsg = "file does not begin with ssh.com key header";
        goto error;
    }
    smemclr(line, strlen(line));
    sfree(line);
    line = NULL;

    headers_done = false;
    while (1) {
        if (!(line = bsgetline(src))) {
            errmsg = "unexpected end of file";
            goto error;
        }
        if (!strcmp(line, "---- END SSH2 ENCRYPTED PRIVATE KEY ----")) {
            sfree(line);
            line = NULL;
            break;                     /* done */
        }
        if ((p = strchr(line, ':')) != NULL) {
            if (headers_done) {
                errmsg = "header found in body of key data";
                goto error;
            }
            *p++ = '\0';
            while (*p && isspace((unsigned char)*p)) p++;
            hdrstart = p - line;

            /*
             * Header lines can end in a trailing backslash for
             * continuation.
             */
            len = hdrstart + strlen(line+hdrstart);
            assert(!line[len]);
            while (line[len-1] == '\\') {
                char *line2;
                int line2len;

                line2 = bsgetline(src);
                if (!line2) {
                    errmsg = "unexpected end of file";
                    goto error;
                }

                line2len = strlen(line2);
                line = sresize(line, len + line2len + 1, char);
                strcpy(line + len - 1, line2);
                len += line2len - 1;
                assert(!line[len]);

                smemclr(line2, strlen(line2));
                sfree(line2);
                line2 = NULL;
            }
            p = line + hdrstart;
            if (!strcmp(line, "Comment")) {
                /* Strip quotes in comment if present. */
                if (p[0] == '"' && p[strlen(p)-1] == '"') {
                    p++;
                    p[strlen(p)-1] = '\0';
                }
                strncpy(ret->comment, p, sizeof(ret->comment));
                ret->comment[sizeof(ret->comment)-1] = '\0';
            }
        } else {
            headers_done = true;

            p = line;
            while (isbase64(*p)) {
                base64_bit[base64_chars++] = *p;
                if (base64_chars == 4) {
                    unsigned char out[3];

                    base64_chars = 0;

                    len = base64_decode_atom(base64_bit, out);

                    if (len <= 0) {
                        errmsg = "invalid base64 encoding";
                        goto error;
                    }

                    put_data(ret->keyblob, out, len);
                }

                p++;
            }
        }
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }

    if (ret->keyblob->len == 0) {
        errmsg = "key body not present";
        goto error;
    }

    if (errmsg_p) *errmsg_p = NULL;
    return ret;

    error:
    if (line) {
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }
    if (ret) {
        strbuf_free(ret->keyblob);
        smemclr(ret, sizeof(*ret));
        sfree(ret);
    }
    if (errmsg_p) *errmsg_p = errmsg;
    return NULL;
}